

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

RefCast * __thiscall MixedArena::alloc<wasm::RefCast>(MixedArena *this)

{
  RefCast *pRVar1;
  
  pRVar1 = (RefCast *)allocSpace(this,0x20,8);
  (pRVar1->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression._id = RefCastId;
  (pRVar1->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type.id = 0;
  pRVar1->safety = Safe;
  return pRVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }